

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O0

void __thiscall front::irGenerator::irGenerator::ir_leave_function(irGenerator *this)

{
  initializer_list<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  bool bVar1;
  int iVar2;
  mapped_type *pmVar3;
  reference pbVar4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>_>_>
  *this_00;
  element_type *peVar5;
  JumpInstruction *this_01;
  long in_RDI;
  string var;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  shared_ptr<mir::inst::JumpInstruction> jumpInst;
  undefined4 in_stack_fffffffffffffda8;
  uint32_t in_stack_fffffffffffffdac;
  VarId *in_stack_fffffffffffffdb0;
  variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
  *this_02;
  optional<mir::inst::VarId> *in_stack_fffffffffffffdb8;
  vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffdc0;
  int bb_false;
  key_type *in_stack_fffffffffffffdc8;
  undefined1 *puVar6;
  JumpInstruction *in_stack_fffffffffffffdd0;
  allocator_type *in_stack_fffffffffffffdd8;
  allocator<char> *in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf0;
  LabelId in_stack_fffffffffffffe1c;
  irGenerator *in_stack_fffffffffffffe20;
  undefined8 **local_1c8;
  variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
  local_190;
  undefined1 local_170 [104];
  undefined1 **local_108;
  undefined8 *local_100 [5];
  undefined1 **local_d8;
  undefined8 local_d0;
  undefined1 in_stack_ffffffffffffff3f;
  vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff40;
  string *in_stack_ffffffffffffff48;
  SymbolKind in_stack_ffffffffffffff54;
  string *in_stack_ffffffffffffff58;
  irGenerator *in_stack_ffffffffffffff60;
  allocator<char> local_81;
  string local_80 [32];
  string local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_30;
  
  std::shared_ptr<mir::inst::JumpInstruction>::shared_ptr
            ((shared_ptr<mir::inst::JumpInstruction> *)0x260a0c);
  ir_label(in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_stack_fffffffffffffdb0);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
                         *)in_stack_fffffffffffffdf0,
                        (key_type *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  local_30 = &pmVar3->_freeList;
  local_38._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
  local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffdb0,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8)), bVar1
        ) {
    pbVar4 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_38);
    std::__cxx11::string::string(local_60,(string *)pbVar4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffdf0,
               (char *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
               in_stack_fffffffffffffde0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffdf0,
               (char *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
               in_stack_fffffffffffffde0);
    local_108 = (undefined1 **)local_100;
    std::variant<int,int,std::__cxx11::string>::
    variant<std::__cxx11::string&,void,void,std::__cxx11::string,void>
              ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffdb0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    local_d8 = (undefined1 **)local_100;
    local_d0 = 1;
    std::
    allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::allocator((allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)0x260b91);
    __l._M_array._4_4_ = in_stack_fffffffffffffdec;
    __l._M_array._0_4_ = in_stack_fffffffffffffde8;
    __l._M_len = (size_type)in_stack_fffffffffffffdf0;
    std::
    vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector((vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffffde0,__l,in_stack_fffffffffffffdd8);
    ir_function_call(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                     in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                     (bool)in_stack_ffffffffffffff3f);
    std::
    vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(in_stack_fffffffffffffdc0);
    std::
    allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~allocator((allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x260c01);
    local_1c8 = &local_d8;
    do {
      local_1c8 = local_1c8 + -5;
      std::
      variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x260c36);
    } while (local_1c8 != local_100);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff58);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff57);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator(&local_81);
    std::__cxx11::string::~string(local_60);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_38);
  }
  this_00 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>_>_>
             *)(in_RDI + 8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_stack_fffffffffffffdb0);
  bb_false = (int)((ulong)in_stack_fffffffffffffdc0 >> 0x20);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
  ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
        *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  std::__shared_ptr_access<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x260e59);
  peVar5 = std::__shared_ptr_access<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x260e65);
  iVar2 = (*(peVar5->super_Displayable)._vptr_Displayable[1])();
  if (iVar2 == 0) {
    operator_new(0x38);
    mir::inst::VarId::VarId(in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac);
    std::optional<mir::inst::VarId>::optional<mir::inst::VarId,_true>
              ((optional<mir::inst::VarId> *)in_stack_fffffffffffffdb0,
               (VarId *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    mir::inst::JumpInstruction::JumpInstruction
              (in_stack_fffffffffffffdd0,
               (JumpInstructionKind)((ulong)in_stack_fffffffffffffdc8 >> 0x20),
               (int)in_stack_fffffffffffffdc8,bb_false,in_stack_fffffffffffffdb8,
               (JumpKind)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
    std::shared_ptr<mir::inst::JumpInstruction>::shared_ptr<mir::inst::JumpInstruction,void>
              ((shared_ptr<mir::inst::JumpInstruction> *)in_stack_fffffffffffffdb0,
               (JumpInstruction *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    std::shared_ptr<mir::inst::JumpInstruction>::operator=
              ((shared_ptr<mir::inst::JumpInstruction> *)in_stack_fffffffffffffdb0,
               (shared_ptr<mir::inst::JumpInstruction> *)
               CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    std::shared_ptr<mir::inst::JumpInstruction>::~shared_ptr
              ((shared_ptr<mir::inst::JumpInstruction> *)0x260f31);
  }
  else if (iVar2 == 1) {
    this_01 = (JumpInstruction *)operator_new(0x38);
    puVar6 = local_170;
    std::optional<mir::inst::VarId>::optional();
    mir::inst::JumpInstruction::JumpInstruction
              (this_01,(JumpInstructionKind)((ulong)puVar6 >> 0x20),(int)puVar6,bb_false,
               in_stack_fffffffffffffdb8,(JumpKind)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
    std::shared_ptr<mir::inst::JumpInstruction>::shared_ptr<mir::inst::JumpInstruction,void>
              ((shared_ptr<mir::inst::JumpInstruction> *)in_stack_fffffffffffffdb0,
               (JumpInstruction *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    std::shared_ptr<mir::inst::JumpInstruction>::operator=
              ((shared_ptr<mir::inst::JumpInstruction> *)in_stack_fffffffffffffdb0,
               (shared_ptr<mir::inst::JumpInstruction> *)
               CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    std::shared_ptr<mir::inst::JumpInstruction>::~shared_ptr
              ((shared_ptr<mir::inst::JumpInstruction> *)0x260fd7);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_stack_fffffffffffffdb0);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>_>_>
  ::operator[](this_00,(key_type *)CONCAT44(iVar2,in_stack_fffffffffffffde8));
  this_02 = &local_190;
  std::
  variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>
  ::
  variant<std::shared_ptr<mir::inst::JumpInstruction>&,void,void,std::shared_ptr<mir::inst::JumpInstruction>,void>
            (this_02,(shared_ptr<mir::inst::JumpInstruction> *)
                     CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
  std::
  vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
  ::push_back((vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
               *)this_02,(value_type *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8)
             );
  std::
  variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
  ::~variant((variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
              *)0x26106f);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x261083);
  std::shared_ptr<mir::inst::JumpInstruction>::~shared_ptr
            ((shared_ptr<mir::inst::JumpInstruction> *)0x261090);
  return;
}

Assistant:

void irGenerator::ir_leave_function() {
  shared_ptr<mir::inst::JumpInstruction> jumpInst;

  ir_label(_ReturnBlockLabelId);

  for (string var : _funcNameToFuncData[_funcStack.back()]._freeList) {
    ir_function_call("void", symbol::SymbolKind::VID, "free", {var});
  }

  switch (_package.functions.at(_funcStack.back()).type->ret->kind()) {
    case mir::types::TyKind::Int: {
      jumpInst =
          shared_ptr<mir::inst::JumpInstruction>(new mir::inst::JumpInstruction(
              mir::inst::JumpInstructionKind::Return, -1, -1,
              VarId(_ReturnVarId), mir::inst::JumpKind::Undefined));
      break;
    }
    case mir::types::TyKind::Void: {
      jumpInst =
          shared_ptr<mir::inst::JumpInstruction>(new mir::inst::JumpInstruction(
              mir::inst::JumpInstructionKind::Return, -1, -1, std::nullopt,
              mir::inst::JumpKind::Undefined));
      break;
    }
    default:
      break;
  }
  _funcNameToInstructions[_funcStack.back()].push_back(jumpInst);
  _funcStack.pop_back();
}